

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printStatus(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,ostream *os,Status stat)

{
  long lVar1;
  char *pcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"SoPlex status       : ",0x16);
  switch(stat) {
  case OPTIMAL:
    pcVar2 = "problem is solved [optimal]";
    lVar1 = 0x1b;
    break;
  case UNBOUNDED:
    pcVar2 = "problem is solved [unbounded]";
LAB_00361eef:
    lVar1 = 0x1d;
    break;
  case INFEASIBLE:
    pcVar2 = "problem is solved [infeasible]";
    lVar1 = 0x1e;
    break;
  case INForUNBD:
    pcVar2 = "problem is solved [infeasible or unbounded]";
    lVar1 = 0x2b;
    break;
  case OPTIMAL_UNSCALED_VIOLATIONS:
    pcVar2 = "problem is solved [optimal with unscaled violations]";
    lVar1 = 0x34;
    break;
  case ERROR:
    pcVar2 = "error [unspecified]";
    lVar1 = 0x13;
    break;
  case NO_RATIOTESTER:
    pcVar2 = "error [no ratiotester loaded]";
    goto LAB_00361eef;
  case NO_PRICER:
    pcVar2 = "error [no pricer loaded]";
    lVar1 = 0x18;
    break;
  case NO_SOLVER:
    pcVar2 = "error [no linear solver loaded]";
    lVar1 = 0x1f;
    break;
  case NOT_INIT:
    pcVar2 = "error [not initialized]";
    lVar1 = 0x17;
    break;
  default:
    pcVar2 = "unknown";
    lVar1 = 7;
    break;
  case ABORT_CYCLING:
    pcVar2 = "solving aborted [cycling]";
    lVar1 = 0x19;
    break;
  case ABORT_TIME:
    pcVar2 = "solving aborted [time limit reached]";
    lVar1 = 0x24;
    break;
  case ABORT_ITER:
    pcVar2 = "solving aborted [iteration limit reached]";
    goto LAB_00361f8d;
  case ABORT_VALUE:
    pcVar2 = "solving aborted [objective limit reached]";
LAB_00361f8d:
    lVar1 = 0x29;
    break;
  case SINGULAR:
    pcVar2 = "basis is singular";
    goto LAB_00361f7f;
  case NO_PROBLEM:
    pcVar2 = "no problem loaded";
LAB_00361f7f:
    lVar1 = 0x11;
    break;
  case REGULAR:
    pcVar2 = "basis is regular";
    lVar1 = 0x10;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void SoPlexBase<R>::printStatus(std::ostream& os, typename SPxSolverBase<R>::Status stat)
{
   os << "SoPlex status       : ";

   switch(stat)
   {
   case SPxSolverBase<R>::ERROR:
      os << "error [unspecified]";
      break;

   case SPxSolverBase<R>::NO_RATIOTESTER:
      os << "error [no ratiotester loaded]";
      break;

   case SPxSolverBase<R>::NO_PRICER:
      os << "error [no pricer loaded]";
      break;

   case SPxSolverBase<R>::NO_SOLVER:
      os << "error [no linear solver loaded]";
      break;

   case SPxSolverBase<R>::NOT_INIT:
      os << "error [not initialized]";
      break;

   case SPxSolverBase<R>::ABORT_CYCLING:
      os << "solving aborted [cycling]";
      break;

   case SPxSolverBase<R>::ABORT_TIME:
      os << "solving aborted [time limit reached]";
      break;

   case SPxSolverBase<R>::ABORT_ITER:
      os << "solving aborted [iteration limit reached]";
      break;

   case SPxSolverBase<R>::ABORT_VALUE:
      os << "solving aborted [objective limit reached]";
      break;

   case SPxSolverBase<R>::NO_PROBLEM:
      os << "no problem loaded";
      break;

   case SPxSolverBase<R>::REGULAR:
      os << "basis is regular";
      break;

   case SPxSolverBase<R>::SINGULAR:
      os << "basis is singular";
      break;

   case SPxSolverBase<R>::OPTIMAL:
      os << "problem is solved [optimal]";
      break;

   case SPxSolverBase<R>::UNBOUNDED:
      os << "problem is solved [unbounded]";
      break;

   case SPxSolverBase<R>::INFEASIBLE:
      os << "problem is solved [infeasible]";
      break;

   case SPxSolverBase<R>::INForUNBD:
      os << "problem is solved [infeasible or unbounded]";
      break;

   case SPxSolverBase<R>::OPTIMAL_UNSCALED_VIOLATIONS:
      os << "problem is solved [optimal with unscaled violations]";
      break;

   default:
   case SPxSolverBase<R>::UNKNOWN:
      os << "unknown";
      break;
   }

   os << "\n";
}